

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

string * __thiscall
ExactFloat::ToUniqueString_abi_cxx11_(string *__return_storage_ptr__,ExactFloat *this)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  size_type *psVar4;
  char prec_buf [20];
  string local_58;
  char local_38 [24];
  
  uVar2 = BN_num_bits((BIGNUM *)(this->bn_).bn_);
  sprintf(local_38,"<%d>",(ulong)uVar2);
  ToString_abi_cxx11_(&local_58,this);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ExactFloat::ToUniqueString() const {
  char prec_buf[20];
  sprintf(prec_buf, "<%d>", prec());
  return ToString() + prec_buf;
}